

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.h
# Opt level: O2

void __thiscall flatbuffers::CodeGenerator::~CodeGenerator(CodeGenerator *this)

{
  this->_vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_002f9220;
  std::__cxx11::string::~string((string *)&this->status_detail);
  return;
}

Assistant:

virtual ~CodeGenerator() = default;